

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointObjectStatePdu.cpp
# Opt level: O2

int __thiscall DIS::PointObjectStatePdu::getMarshalledSize(PointObjectStatePdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_objectID);
  iVar3 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar4 = ObjectType::getMarshalledSize(&this->_objectType);
  iVar5 = Vector3Double::getMarshalledSize(&this->_objectLocation);
  iVar6 = EulerAngles::getMarshalledSize(&this->_objectOrientation);
  iVar7 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar8 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  return iVar8 + iVar6 + iVar5 + iVar7 + iVar4 + iVar3 + iVar2 + iVar1 + 0x10;
}

Assistant:

int PointObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _modifications
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType
   marshalSize = marshalSize + _objectLocation.getMarshalledSize();  // _objectLocation
   marshalSize = marshalSize + _objectOrientation.getMarshalledSize();  // _objectOrientation
   marshalSize = marshalSize + 8;  // _objectAppearance
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + 4;  // _pad2
    return marshalSize;
}